

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPixmapCache::Key>::emplace<QPixmapCache::Key_const&>
          (QMovableArrayOps<QPixmapCache::Key> *this,qsizetype i,Key *args)

{
  qsizetype *pqVar1;
  Key **ppKVar2;
  long lVar3;
  Data *pDVar4;
  Key *pKVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter IStack_58;
  Key tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
           super_QArrayDataPointer<QPixmapCache::Key>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QPixmapCache::Key>).super_QArrayDataPointer<QPixmapCache::Key>
        .size == i) {
      qVar6 = QArrayDataPointer<QPixmapCache::Key>::freeSpaceAtEnd
                        ((QArrayDataPointer<QPixmapCache::Key> *)this);
      if (qVar6 == 0) goto LAB_00294b64;
      QPixmapCache::Key::Key
                ((this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.ptr +
                 (this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.size,args);
LAB_00294c54:
      pqVar1 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
                super_QArrayDataPointer<QPixmapCache::Key>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_00294c13;
    }
LAB_00294b64:
    if (i == 0) {
      qVar6 = QArrayDataPointer<QPixmapCache::Key>::freeSpaceAtBegin
                        ((QArrayDataPointer<QPixmapCache::Key> *)this);
      if (qVar6 != 0) {
        QPixmapCache::Key::Key
                  ((this->super_QGenericArrayOps<QPixmapCache::Key>).
                   super_QArrayDataPointer<QPixmapCache::Key>.ptr + -1,args);
        ppKVar2 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
                   super_QArrayDataPointer<QPixmapCache::Key>.ptr;
        *ppKVar2 = *ppKVar2 + -1;
        goto LAB_00294c54;
      }
    }
  }
  tmp.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmapCache::Key::Key(&tmp,args);
  bVar7 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
          super_QArrayDataPointer<QPixmapCache::Key>.size != 0;
  QArrayDataPointer<QPixmapCache::Key>::detachAndGrow
            ((QArrayDataPointer<QPixmapCache::Key> *)this,(uint)(i == 0 && bVar7),1,(Key **)0x0,
             (QArrayDataPointer<QPixmapCache::Key> *)0x0);
  if (i == 0 && bVar7) {
    pKVar5 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
             super_QArrayDataPointer<QPixmapCache::Key>.ptr;
    pKVar5[-1].d = tmp.d;
    tmp.d = (KeyData *)0x0;
    (this->super_QGenericArrayOps<QPixmapCache::Key>).super_QArrayDataPointer<QPixmapCache::Key>.ptr
         = pKVar5 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
              super_QArrayDataPointer<QPixmapCache::Key>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QPixmapCache::Key> *)this,i,1);
    (IStack_58.displaceFrom)->d = tmp.d;
    tmp.d = (KeyData *)0x0;
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QPixmapCache::Key::~Key(&tmp);
LAB_00294c13:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }